

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# options.cpp
# Opt level: O3

int __thiscall
zmq::options_t::set_curve_key(options_t *this,uint8_t *destination_,void *optval_,size_t optvallen_)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  uint8_t *puVar5;
  string s;
  char z85_key [41];
  long *local_78 [2];
  long local_68 [2];
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined1 local_30;
  
  if (optvallen_ == 0x29) {
    local_78[0] = local_68;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_78,optval_,(long)optval_ + 0x29)
    ;
    puVar5 = zmq_z85_decode(destination_,(char *)local_78[0]);
    if (puVar5 != (uint8_t *)0x0) {
      this->mechanism = 2;
    }
    if (local_78[0] != local_68) {
      operator_delete(local_78[0],local_68[0] + 1);
    }
    if (puVar5 != (uint8_t *)0x0) {
      return 0;
    }
LAB_0017c5e0:
    iVar4 = -1;
  }
  else {
    if (optvallen_ == 0x28) {
      local_38 = *(undefined8 *)((long)optval_ + 0x20);
      local_58 = *optval_;
      uStack_50 = *(undefined8 *)((long)optval_ + 8);
      local_48 = *(undefined8 *)((long)optval_ + 0x10);
      uStack_40 = *(undefined8 *)((long)optval_ + 0x18);
      local_30 = 0;
      puVar5 = zmq_z85_decode(destination_,(char *)&local_58);
      if (puVar5 == (uint8_t *)0x0) goto LAB_0017c5e0;
    }
    else {
      if (optvallen_ != 0x20) goto LAB_0017c5e0;
      uVar1 = *optval_;
      uVar2 = *(undefined8 *)((long)optval_ + 8);
      uVar3 = *(undefined8 *)((long)optval_ + 0x18);
      *(undefined8 *)(destination_ + 0x10) = *(undefined8 *)((long)optval_ + 0x10);
      *(undefined8 *)(destination_ + 0x18) = uVar3;
      *(undefined8 *)destination_ = uVar1;
      *(undefined8 *)(destination_ + 8) = uVar2;
    }
    this->mechanism = 2;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int zmq::options_t::set_curve_key (uint8_t *destination_,
                                   const void *optval_,
                                   size_t optvallen_)
{
    switch (optvallen_) {
        case CURVE_KEYSIZE:
            memcpy (destination_, optval_, optvallen_);
            mechanism = ZMQ_CURVE;
            return 0;

        case CURVE_KEYSIZE_Z85 + 1: {
            const std::string s (static_cast<const char *> (optval_),
                                 optvallen_);

            if (zmq_z85_decode (destination_, s.c_str ())) {
                mechanism = ZMQ_CURVE;
                return 0;
            }
            break;
        }

        case CURVE_KEYSIZE_Z85:
            char z85_key[CURVE_KEYSIZE_Z85 + 1];
            memcpy (z85_key, reinterpret_cast<const char *> (optval_),
                    optvallen_);
            z85_key[CURVE_KEYSIZE_Z85] = 0;
            if (zmq_z85_decode (destination_, z85_key)) {
                mechanism = ZMQ_CURVE;
                return 0;
            }
            break;

        default:
            break;
    }
    return -1;
}